

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

void __thiscall vmips::Binary::output(Binary *this,ostream *out)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  
  iVar1 = (*(this->super_Instruction)._vptr_Instruction[1])();
  poVar2 = std::operator<<(out,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," ");
  operator<<(poVar2,(this->lhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  poVar2 = std::operator<<(poVar2,", ");
  operator<<(poVar2,(this->rhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  return;
}

Assistant:

void Binary::output(std::ostream &out) const {
    out << name() << " " << *lhs << ", " << *rhs;
}